

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          bool is_writer)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  Type TVar4;
  undefined7 extraout_var;
  string *extraout_RAX;
  string *psVar5;
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  TVar4 = FieldDescriptor::type((FieldDescriptor *)this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             *(char **)(FieldDescriptor::kTypeToName + (ulong)TVar4 * 8),(allocator *)&local_38);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  cVar1 = *pcVar2;
  if ((byte)(cVar1 + 0x9fU) < 0x1a) {
    *pcVar2 = cVar1 + -0x20;
  }
  bVar3 = FieldDescriptor::is_packed((FieldDescriptor *)this);
  if (bVar3) {
    std::operator+(&local_38,"Packed",__return_storage_ptr__);
  }
  else {
    if ((char)field == '\0') {
      return (string *)CONCAT71(extraout_var,bVar3);
    }
    if (*(int *)(this + 0x4c) != 3) {
      return (string *)CONCAT71(extraout_var,bVar3);
    }
    std::operator+(&local_38,"Repeated",__return_storage_ptr__);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  psVar5 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar5) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    psVar5 = extraout_RAX;
  }
  return psVar5;
}

Assistant:

string JSBinaryReadWriteMethodName(const FieldDescriptor* field,
                                   bool is_writer) {
  string name = JSBinaryReaderMethodType(field);
  if (field->is_packed()) {
    name = "Packed" + name;
  } else if (is_writer && field->is_repeated()) {
    name = "Repeated" + name;
  }
  return name;
}